

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromUnsignedParts
          (IEEEFloat *this,integerPart *src,uint srcCount,roundingMode rounding_mode)

{
  uint uVar1;
  uint uVar2;
  opStatus oVar3;
  uint uVar4;
  uint srcBits;
  lostFraction lost_fraction;
  Significand *dst;
  uint bits;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  uVar2 = APInt::tcMSB(src,srcCount);
  uVar4 = uVar2 + 1;
  srcBits = this->semantics->precision;
  if (srcBits - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  else {
    dst = &this->significand;
  }
  uVar1 = srcBits + 0x40;
  bits = uVar4 - srcBits;
  if (uVar4 < srcBits) {
    this->exponent = (short)srcBits + -1;
    lost_fraction = lfExactlyZero;
    bits = 0;
    srcBits = uVar4;
  }
  else {
    this->exponent = (ExponentType)uVar2;
    lost_fraction = lostFractionThroughTruncation(src,srcCount,bits);
  }
  APInt::tcExtract(&dst->part,uVar1 >> 6,src,srcBits,bits);
  oVar3 = normalize(this,rounding_mode,lost_fraction);
  return oVar3;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromUnsignedParts(
    const integerPart *src, unsigned int srcCount, roundingMode rounding_mode) {
  unsigned int omsb, precision, dstCount;
  integerPart *dst;
  lostFraction lost_fraction;

  category = fcNormal;
  omsb = APInt::tcMSB(src, srcCount) + 1;
  dst = significandParts();
  dstCount = partCount();
  precision = semantics->precision;

  /* We want the most significant PRECISION bits of SRC.  There may not
     be that many; extract what we can.  */
  if (precision <= omsb) {
    exponent = omsb - 1;
    lost_fraction = lostFractionThroughTruncation(src, srcCount,
                                                  omsb - precision);
    APInt::tcExtract(dst, dstCount, src, precision, omsb - precision);
  } else {
    exponent = precision - 1;
    lost_fraction = lfExactlyZero;
    APInt::tcExtract(dst, dstCount, src, omsb, 0);
  }

  return normalize(rounding_mode, lost_fraction);
}